

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall
Fl_Tree::select(Fl_Tree *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
               timeval *__timeout)

{
  char cVar1;
  fd_set *__readfds_00;
  undefined4 in_register_00000034;
  Fl_Tree_Item *this_00;
  int alreadySelected;
  int docallback_local;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  this_00 = (Fl_Tree_Item *)CONCAT44(in_register_00000034,__nfds);
  cVar1 = Fl_Tree_Item::is_selected(this_00);
  if (cVar1 == '\0') {
    Fl_Tree_Item::select(this_00,1,__readfds_00,__writefds,__exceptfds,__timeout);
    Fl_Widget::set_changed((Fl_Widget *)this);
    if ((int)__readfds != 0) {
      do_callback_for_item(this,this_00,FL_TREE_REASON_SELECTED);
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree::select(Fl_Tree_Item *item, int docallback) {
  int alreadySelected = item->is_selected();
  if ( !alreadySelected ) {
    item->select();
    set_changed();
    if ( docallback ) {
      do_callback_for_item(item, FL_TREE_REASON_SELECTED);
    }
    redraw();
    return(1);
  }
#if FLTK_ABI_VERSION >= 10301
  // NEW
  if ( alreadySelected ) {
    if ( (item_reselect_mode() == FL_TREE_SELECTABLE_ALWAYS) && docallback ) {
      do_callback_for_item(item, FL_TREE_REASON_RESELECTED);
    }
  }
#endif /*FLTK_ABI_VERSION*/
  return(0);
}